

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemeReference.cpp
# Opt level: O1

void references::scheme::test_equal_<std::__cxx11::string,char[3]>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
               char (*expected_value) [3],char *file,int line)

{
  int iVar1;
  ostream *poVar2;
  size_t sVar3;
  long lVar4;
  char *pcVar5;
  char local_21;
  
  g_test_count = g_test_count + 1;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,&local_21,1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,") : ",4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," expected ",10);
  sVar3 = strlen(*expected_value);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,*expected_value,sVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", got ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,(value->_M_dataplus)._M_p,value->_M_string_length);
  iVar1 = std::__cxx11::string::compare((char *)value);
  if (iVar1 == 0) {
    pcVar5 = " - success\n";
    lVar4 = 0xb;
  }
  else {
    g_fault_count = g_fault_count + 1;
    pcVar5 = " - FAIL\n";
    lVar4 = 8;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar5,lVar4);
  return;
}

Assistant:

void test_equal_(const T1 & value, const T2 & expected_value, const char * file, int line)
{
	++g_test_count;
	std::cerr
		//<< file
		<< '(' << line << ") : "
		<< " expected " << expected_value
		<< ", got " << value;
	if (value != expected_value) {
		++g_fault_count;
		std::cerr << " - FAIL\n";
	} else {
		std::cerr << " - success\n";
	}
}